

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall icu_63::RuleBasedBreakIterator::getRuleStatus(RuleBasedBreakIterator *this)

{
  int32_t tagVal;
  int32_t idx;
  RuleBasedBreakIterator *this_local;
  
  return this->fData->fRuleStatusTable
         [this->fRuleStatusIndex + this->fData->fRuleStatusTable[this->fRuleStatusIndex]];
}

Assistant:

int32_t  RuleBasedBreakIterator::getRuleStatus() const {

    // fLastRuleStatusIndex indexes to the start of the appropriate status record
    //                                                 (the number of status values.)
    //   This function returns the last (largest) of the array of status values.
    int32_t  idx = fRuleStatusIndex + fData->fRuleStatusTable[fRuleStatusIndex];
    int32_t  tagVal = fData->fRuleStatusTable[idx];

    return tagVal;
}